

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  uint *__ptr;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  
  pvVar3 = vi->codec_setup;
  __ptr = (uint *)calloc(1,0x448);
  lVar4 = oggpack_read(opb,5);
  uVar8 = (uint)lVar4;
  *__ptr = uVar8;
  if (0 < (int)uVar8) {
    uVar13 = 0;
    uVar14 = 0xffffffff;
    do {
      uVar5 = oggpack_read(opb,4);
      __ptr[uVar13 + 1] = (uint)uVar5;
      uVar15 = uVar5 & 0xffffffff;
      if ((int)(uint)uVar5 < (int)uVar14) {
        uVar15 = uVar14;
      }
      uVar13 = uVar13 + 1;
      uVar14 = uVar15;
    } while ((uVar8 & 0x7fffffff) != uVar13);
    if (-1 < (int)uVar15) {
      puVar12 = __ptr + 0x50;
      uVar14 = 0;
      do {
        lVar4 = oggpack_read(opb,3);
        __ptr[uVar14 + 0x20] = (int)lVar4 + 1;
        lVar4 = oggpack_read(opb,2);
        uVar8 = (uint)lVar4;
        __ptr[uVar14 + 0x30] = uVar8;
        if ((int)uVar8 < 0) {
LAB_0012145f:
          free(__ptr);
          return (vorbis_info_floor *)0x0;
        }
        if (uVar8 == 0) {
          uVar10 = __ptr[uVar14 + 0x40];
        }
        else {
          lVar4 = oggpack_read(opb,8);
          uVar10 = (uint)lVar4;
          __ptr[uVar14 + 0x40] = uVar10;
        }
        if (((int)uVar10 < 0) || (*(int *)((long)pvVar3 + 0x24) <= (int)uVar10)) goto LAB_0012145f;
        if (uVar8 != 0x1f) {
          lVar4 = 0;
          do {
            lVar6 = oggpack_read(opb,8);
            uVar8 = (uint)lVar6 - 1;
            puVar12[lVar4] = uVar8;
            if ((0x80000000 < (uint)lVar6) || (*(int *)((long)pvVar3 + 0x24) <= (int)uVar8))
            goto LAB_0012145f;
            lVar4 = lVar4 + 1;
          } while (lVar4 < 1 << ((byte)__ptr[uVar14 + 0x30] & 0x1f));
        }
        uVar14 = uVar14 + 1;
        puVar12 = puVar12 + 8;
      } while (uVar14 != (int)uVar15 + 1);
    }
  }
  lVar4 = oggpack_read(opb,2);
  __ptr[0xd0] = (int)lVar4 + 1;
  lVar4 = oggpack_read(opb,4);
  uVar8 = *__ptr;
  if ((int)uVar8 < 1) {
    uVar10 = 1 << ((byte)lVar4 & 0x1f);
  }
  else {
    uVar10 = 1 << ((byte)lVar4 & 0x1f);
    lVar6 = 0;
    iVar9 = 0;
    iVar11 = 0;
    do {
      uVar2 = __ptr[(long)(int)__ptr[lVar6 + 1] + 0x20];
      iVar1 = uVar2 + iVar11;
      if (iVar9 < iVar1) {
        lVar16 = 0;
        do {
          lVar7 = oggpack_read(opb,(int)lVar4);
          uVar8 = (uint)lVar7;
          __ptr[(long)iVar9 + lVar16 + 0xd3] = uVar8;
          if (((int)uVar8 < 0) || ((int)uVar10 <= (int)uVar8)) goto LAB_0012145f;
          lVar16 = lVar16 + 1;
        } while ((uVar2 + iVar11) - iVar9 != (int)lVar16);
        uVar8 = *__ptr;
        iVar9 = iVar1;
      }
      lVar6 = lVar6 + 1;
      iVar11 = iVar1;
    } while (lVar6 < (int)uVar8);
  }
  __ptr[0xd1] = 0;
  __ptr[0xd2] = uVar10;
  return __ptr;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=(vorbis_info_floor1 *)_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
	goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */ 
  rangebits=oggpack_read(opb,4);

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]]; 
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
	goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  return(info);
  
 err_out:
  floor1_free_info(info);
  return(NULL);
}